

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O2

void __thiscall
Minisat::StringOption::StringOption
          (StringOption *this,char *c,char *n,char *d,char *def,bool tunable,Option *dependOn)

{
  string *this_00;
  allocator local_19;
  
  Option::Option(&this->super_Option,n,d,c,"<std::string>",tunable,dependOn);
  (this->super_Option)._vptr_Option = (_func_int **)&PTR__StringOption_00110d00;
  if (def == (char *)0x0) {
    this_00 = (string *)0x0;
  }
  else {
    this_00 = (string *)operator_new(0x20);
    std::__cxx11::string::string((string *)this_00,def,&local_19);
  }
  this->value = this_00;
  this->defaultValue = def;
  return;
}

Assistant:

StringOption(const char *c, const char *n, const char *d, const char *def = NULL, bool tunable = false, Option *dependOn = 0)
      : Option(n, d, c, "<std::string>", tunable, dependOn), value(def == NULL ? NULL : new std::string(def)), defaultValue(def)
    {
    }